

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_deflate(archive *a,la_zstream *lastrm,int level,int withheader)

{
  int iVar1;
  undefined8 *__ptr;
  int in_ECX;
  undefined8 uVar2;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  z_stream *strm;
  archive *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (*(int *)(in_RSI + 8) != 0) {
    compression_end(in_stack_ffffffffffffffc8,(la_zstream *)0x174a80);
  }
  __ptr = (undefined8 *)calloc(1,0x70);
  if (__ptr == (undefined8 *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for gzip stream");
    local_4 = -0x1e;
  }
  else {
    *__ptr = *in_RSI;
    *(int *)(__ptr + 1) = (int)in_RSI[1];
    __ptr[2] = in_RSI[2];
    __ptr[3] = in_RSI[3];
    *(int *)(__ptr + 4) = (int)in_RSI[4];
    __ptr[5] = in_RSI[5];
    uVar2 = 0xfffffff1;
    if (in_ECX != 0) {
      uVar2 = 0xf;
    }
    iVar1 = deflateInit2_(__ptr,in_EDX,8,uVar2,8,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      in_RSI[9] = __ptr;
      *(undefined4 *)(in_RSI + 8) = 1;
      in_RSI[10] = compression_code_deflate;
      in_RSI[0xb] = compression_end_deflate;
      local_4 = 0;
    }
    else {
      free(__ptr);
      in_RSI[9] = 0;
      archive_set_error(in_RDI,-1,"Internal error initializing compression library");
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

static int
compression_init_encoder_deflate(struct archive *a,
    struct la_zstream *lastrm, int level, int withheader)
{
	z_stream *strm;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for gzip stream");
		return (ARCHIVE_FATAL);
	}
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	if (deflateInit2(strm, level, Z_DEFLATED,
	    (withheader)?15:-15,
	    8, Z_DEFAULT_STRATEGY) != Z_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lastrm->real_stream = strm;
	lastrm->valid = 1;
	lastrm->code = compression_code_deflate;
	lastrm->end = compression_end_deflate;
	return (ARCHIVE_OK);
}